

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O2

int FFSdecode_to_buffer(FFSContext iocontext,char *src,void *dest)

{
  int iVar1;
  FFSTypeHandle_conflict ioformat;
  
  ioformat = FFSTypeHandle_from_encode(iocontext,src);
  if (ioformat != (FFSTypeHandle_conflict)0x0) {
    iVar1 = check_conversion(ioformat);
    if (iVar1 != 0) {
      iVar1 = FFSinternal_decode(ioformat,src,dest,1);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

extern int
FFSdecode_to_buffer(FFSContext iocontext, char *src, void *dest)
{
    FFSTypeHandle ioformat;
    ioformat = FFSTypeHandle_from_encode(iocontext, src);
    if (ioformat == NULL) {
	return 0;
    }
    if (!check_conversion(ioformat)) {
	return 0;
    }
    return FFSinternal_decode(ioformat, src, dest, 1);
}